

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# User.h
# Opt level: O3

void __thiscall User::User(User *this,User *other)

{
  (this->username)._M_dataplus._M_p = (pointer)&(this->username).field_2;
  (this->username)._M_string_length = 0;
  (this->username).field_2._M_local_buf[0] = '\0';
  (this->alias)._M_dataplus._M_p = (pointer)&(this->alias).field_2;
  (this->alias)._M_string_length = 0;
  (this->alias).field_2._M_local_buf[0] = '\0';
  (this->bio)._M_dataplus._M_p = (pointer)&(this->bio).field_2;
  (this->bio)._M_string_length = 0;
  (this->bio).field_2._M_local_buf[0] = '\0';
  (this->password)._M_dataplus._M_p = (pointer)&(this->password).field_2;
  (this->password)._M_string_length = 0;
  (this->password).field_2._M_local_buf[0] = '\0';
  this->id = other->id;
  std::__cxx11::string::_M_assign((string *)&this->username);
  std::__cxx11::string::_M_assign((string *)&this->alias);
  std::__cxx11::string::_M_assign((string *)&this->bio);
  std::__cxx11::string::_M_assign((string *)&this->password);
  return;
}

Assistant:

User(const User& other)
  {
	  this->id = other.id;
	  this->username = other.username;
	  this->alias = other.alias;
	  this->bio = other.bio;
	  this->password = other.password;
  }